

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

int copy_zip_file(FILE *zip,file_entry_t *file,FILE *ozip,CentralDirectoryEntry *ent)

{
  int iVar1;
  size_t sVar2;
  char *__s1;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong __size;
  undefined1 auVar6 [16];
  LocalFileHeader lfh;
  
  iVar4 = 0;
  iVar1 = fseek((FILE *)ozip,(ulong)ent->LocalHeaderOffset,0);
  iVar5 = 0;
  if ((((((iVar1 == 0) && (sVar2 = fread(&lfh,0x1e,1,(FILE *)ozip), sVar2 == 1)) &&
        (iVar5 = iVar4, lfh.Flags == ent->Flags)) &&
       ((lfh.Method == ent->Method && (lfh.CRC32 == ent->CRC32)))) &&
      ((lfh.CompressedSize == ent->CompressedSize &&
       ((lfh.UncompressedSize == ent->UncompressedSize && (lfh.NameLength == ent->NameLength))))))
     && (lfh.ExtraLength == ent->ExtraLength)) {
    __size = (ulong)(lfh.CompressedSize + lfh.NameLength);
    __s1 = (char *)malloc(__size);
    if (__s1 != (char *)0x0) {
      sVar2 = fread(__s1,1,__size,(FILE *)ozip);
      if ((sVar2 == __size) &&
         (iVar1 = strncmp(__s1,(char *)(ent + 1),(ulong)(uint)lfh.NameLength), iVar1 == 0)) {
        lVar3 = ftell((FILE *)zip);
        file->zip_offset = (uint)lVar3;
        sVar2 = fwrite(&lfh,0x1e,1,(FILE *)zip);
        if ((sVar2 == 1) && (sVar2 = fwrite(__s1,1,__size,(FILE *)zip), sVar2 == __size)) {
          free(__s1);
          auVar6 = pshuflw(ZEXT416((uint)lfh._10_4_),ZEXT416((uint)lfh._10_4_),0xe1);
          file->date = (short)auVar6._0_4_;
          file->time = (short)((uint)auVar6._0_4_ >> 0x10);
          file->uncompressed_size = lfh.UncompressedSize;
          file->compressed_size = lfh.CompressedSize;
          file->method = lfh.Method;
          file->crc32 = lfh.CRC32;
          iVar5 = 1;
        }
        else {
          free(__s1);
          iVar5 = -1;
        }
      }
      else {
        free(__s1);
      }
    }
  }
  return iVar5;
}

Assistant:

int copy_zip_file(FILE *zip, file_entry_t *file, FILE *ozip, CentralDirectoryEntry *ent)
{
	LocalFileHeader lfh;
	BYTE *buf;
	UINT32 buf_size;

	if (fseek(ozip, LittleLong(ent->LocalHeaderOffset), SEEK_SET) != 0)
	{
		return 0;
	}
	if (fread(&lfh, sizeof(lfh), 1, ozip) != 1)
	{
		return 0;
	}
	// Check to make sure the local header matches the central directory.
	if (lfh.Flags != ent->Flags || lfh.Method != ent->Method ||
		lfh.CRC32 != ent->CRC32 || lfh.CompressedSize != ent->CompressedSize ||
		lfh.UncompressedSize != ent->UncompressedSize ||
		lfh.NameLength != ent->NameLength || lfh.ExtraLength != ent->ExtraLength)
	{
		return 0;
	}
	buf_size = LittleShort(lfh.NameLength) + LittleLong(lfh.CompressedSize);
	buf = malloc(buf_size);
	if (buf == NULL)
	{
		return 0;
	}
	if (fread(buf, 1, buf_size, ozip) != buf_size)
	{
		free(buf);
		return 0;
	}
	// Check to be sure name matches.
	if (strncmp((char *)buf, (char *)(ent + 1), LittleShort(lfh.NameLength)) != 0)
	{
		free(buf);
		return 0;
	}
	// Looks good. Let's write it in.
	file->zip_offset = ftell(zip);
	if (fwrite(&lfh, sizeof(lfh), 1, zip) != 1 ||
		fwrite(buf, 1, buf_size, zip) != buf_size)
	{
		free(buf);
		return -1;
	}
	free(buf);
	file->date = lfh.ModDate;
	file->time = lfh.ModTime;
	file->uncompressed_size = LittleLong(lfh.UncompressedSize);
	file->compressed_size = LittleLong(lfh.CompressedSize);
	file->method = LittleShort(lfh.Method);
	file->crc32 = lfh.CRC32;
	return 1;
}